

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_4db4e7::Handlers::addBare(Handlers *this,bare_handler_t *fn)

{
  JSONHandler *this_00;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  Handlers *local_38;
  _Any_data local_30;
  code *local_20;
  undefined8 uStack_18;
  
  this_00 = this->jh;
  local_38 = this;
  std::function<void_()>::function((function<void_()> *)&local_30,fn);
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x28);
  *(Handlers **)local_58._M_unused._0_8_ = local_38;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x18) = 0;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x20) = uStack_18;
  if (local_20 != (code *)0x0) {
    *(void **)((long)local_58._M_unused._0_8_ + 8) = local_30._M_unused._M_object;
    *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x10) = local_30._8_8_;
    *(code **)((long)local_58._M_unused._0_8_ + 0x18) = local_20;
    local_20 = (code *)0x0;
    uStack_18 = 0;
  }
  pcStack_40 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:127:26)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:127:26)>
             ::_M_manager;
  JSONHandler::addStringHandler(this_00,(string_handler_t *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return;
}

Assistant:

void
Handlers::addBare(bare_handler_t fn)
{
    jh->addStringHandler([this, fn](std::string const& path, std::string const& parameter) {
        if (!parameter.empty()) {
            QTC::TC("qpdf", "QPDFJob json bare not empty");
            usage(path + ": value must be the empty string");
        } else {
            fn();
        }
    });
}